

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O3

void __thiscall Temperature_Rankine_Test::TestBody(Temperature_Rankine_Test *this)

{
  double unaff_RBX;
  char *pcVar1;
  char *pcVar2;
  double unaff_retaddr;
  double in_stack_00000008;
  AssertionResult gtest_ar;
  precise_unit rankine;
  AssertHelper in_stack_ffffffffffffffc8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd0;
  char local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  pcVar2 = (char *)0x3fe1c71c71c71c72;
  units::convert<units::unit,units::precise_unit>
            (0.0,(unit *)&units::K,(precise_unit *)&stack0xffffffffffffffe8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0._M_head_impl,(char *)in_stack_ffffffffffffffc8.data_,
             pcVar2,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x169,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffd0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  units::convert<units::precise_unit,units::precise_unit>
            (459.67,(precise_unit *)&stack0xffffffffffffffe8,(precise_unit *)units::precise::degC);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0._M_head_impl,(char *)in_stack_ffffffffffffffc8.data_,
             pcVar2,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x16b,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffffd0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  units::convert<units::precise_unit,units::precise_unit>
            (0.0,(precise_unit *)units::precise::degC,(precise_unit *)&stack0xffffffffffffffe8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0._M_head_impl,(char *)in_stack_ffffffffffffffc8.data_,
             pcVar2,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x16c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffd0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  units::convert<units::precise_unit,units::precise_unit>
            (100.0,(precise_unit *)units::precise::degC,(precise_unit *)&stack0xffffffffffffffe8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0._M_head_impl,(char *)in_stack_ffffffffffffffc8.data_,
             pcVar2,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x16d,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffd0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  units::convert<units::precise_unit,units::unit>
            (0.0,(precise_unit *)&stack0xffffffffffffffe8,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0._M_head_impl,(char *)in_stack_ffffffffffffffc8.data_,
             pcVar2,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_28 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if (in_stack_ffffffffffffffd0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(Temperature, Rankine)
{
    using namespace units;
    auto rankine = precise::temperature::rankine;

    EXPECT_FALSE(is_temperature(rankine));
    EXPECT_NEAR(convert(0.0, K, rankine), 0.0, test::tolerance);
    EXPECT_NEAR(
        convert(459.67, rankine, precise::degC), -17.7777777, test::tolerance);
    EXPECT_NEAR(convert(0.0, precise::degC, rankine), 491.67, test::tolerance);
    EXPECT_NEAR(convert(100, precise::degC, rankine), 671.67, test::tolerance);
    EXPECT_NEAR(convert(0, rankine, degF), -459.67, test::tolerance);
}